

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QPainterPath::Element>::clear(QList<QPainterPath::Element> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<QPainterPath::Element> *this_00;
  __off_t __length;
  QArrayDataPointer<QPainterPath::Element> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QPainterPath::Element> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QPainterPath::Element> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QPainterPath::Element> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QPainterPath::Element>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QPainterPath::Element>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QPainterPath::Element> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QPainterPath::Element>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QPainterPath::Element>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QPainterPath::Element>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QPainterPath::Element>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<QPainterPath::Element> *)
                QArrayDataPointer<QPainterPath::Element>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QPainterPath::Element>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }